

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O1

void Gia_ManPrintCollect2_rec(Gia_Man_t *p,Gia_Obj_t *pObj,Vec_Int_t *vNodes)

{
  uint *puVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  Gia_Obj_t *pGVar5;
  
  pGVar5 = p->pObjs;
  if ((pGVar5 <= pObj) && (pObj < pGVar5 + p->nObjs)) {
    if (0 < (long)vNodes->nSize) {
      lVar4 = 0;
      do {
        if (vNodes->pArray[lVar4] == (int)((ulong)((long)pObj - (long)pGVar5) >> 2) * -0x55555555) {
          return;
        }
        lVar4 = lVar4 + 1;
      } while (vNodes->nSize != lVar4);
    }
    if ((*(ulong *)pObj & 0x1fffffff) != 0x1fffffff) {
      Gia_ManPrintCollect2_rec(p,pObj + -(*(ulong *)pObj & 0x1fffffff),vNodes);
    }
    uVar2 = (uint)*(undefined8 *)pObj;
    if ((~uVar2 & 0x1fffffff) != 0 && -1 < (int)uVar2) {
      Gia_ManPrintCollect2_rec
                (p,pObj + -(ulong)((uint)((ulong)*(undefined8 *)pObj >> 0x20) & 0x1fffffff),vNodes);
    }
    pGVar5 = p->pObjs;
    if ((pGVar5 <= pObj) && (pObj < pGVar5 + p->nObjs)) {
      puVar1 = p->pMuxes;
      if ((puVar1 != (uint *)0x0) &&
         (iVar3 = (int)((ulong)((long)pObj - (long)pGVar5) >> 2), puVar1[iVar3 * -0x55555555] != 0))
      {
        if (puVar1 == (uint *)0x0) {
          pGVar5 = (Gia_Obj_t *)0x0;
        }
        else {
          if ((int)puVar1[iVar3 * -0x55555555] < 0) {
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                          ,0x12f,"int Abc_Lit2Var(int)");
          }
          uVar2 = puVar1[iVar3 * -0x55555555] >> 1;
          if (p->nObjs <= (int)uVar2) {
            __assert_fail("v >= 0 && v < p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                          ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
          }
          pGVar5 = pGVar5 + uVar2;
        }
        Gia_ManPrintCollect2_rec(p,pGVar5,vNodes);
      }
      pGVar5 = p->pObjs;
      if ((pGVar5 <= pObj) && (pObj < pGVar5 + p->nObjs)) {
        Vec_IntPush(vNodes,(int)((ulong)((long)pObj - (long)pGVar5) >> 2) * -0x55555555);
        return;
      }
    }
  }
  __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

void Gia_ManPrintCollect2_rec( Gia_Man_t * p, Gia_Obj_t * pObj, Vec_Int_t * vNodes )
{
    if ( Vec_IntFind(vNodes, Gia_ObjId(p, pObj)) >= 0 )
        return;
    if ( Gia_ObjIsCo(pObj) || Gia_ObjIsAnd(pObj) )
        Gia_ManPrintCollect2_rec( p, Gia_ObjFanin0(pObj), vNodes );
    if ( Gia_ObjIsAnd(pObj) )
        Gia_ManPrintCollect2_rec( p, Gia_ObjFanin1(pObj), vNodes );
    if ( Gia_ObjIsMux(p, pObj) )
        Gia_ManPrintCollect2_rec( p, Gia_ObjFanin2(p, pObj), vNodes );
    Vec_IntPush( vNodes, Gia_ObjId(p, pObj) );
}